

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O3

void geometrycentral::surface::writeSurfaceMesh
               (SurfaceMesh *mesh,EmbeddedGeometryInterface *geometry,ostream *out,string *type)

{
  pointer pcVar1;
  SimplePolygonMesh simpleMesh;
  vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> local_b8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_a0;
  string local_88;
  SimplePolygonMesh local_68;
  
  SurfaceMesh::getFaceVertexList(&local_a0,mesh);
  anon_unknown_19::geometryToStdVector(&local_b8,mesh,geometry);
  SimplePolygonMesh::SimplePolygonMesh
            (&local_68,
             (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_a0,
             (vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
             &local_b8);
  if (local_b8.
      super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0);
  pcVar1 = (type->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + type->_M_string_length);
  SimplePolygonMesh::writeMesh(&local_68,(ostream *)out,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ::std::
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  ::~vector((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
             *)&local_68.paramCoordinates);
  if (local_68.vertexCoordinates.
      super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.vertexCoordinates.
                    super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_68);
  return;
}

Assistant:

void writeSurfaceMesh(SurfaceMesh& mesh, EmbeddedGeometryInterface& geometry, std::ostream& out, std::string type) {
  SimplePolygonMesh simpleMesh(mesh.getFaceVertexList(), geometryToStdVector(mesh, geometry));
  simpleMesh.writeMesh(out, type);
}